

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_IROR_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint32_t uVar1;
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
  if (*(char *)(in_RSI + 2) == *(char *)(in_RSI + 1)) {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) + 200);
    uVar1 = Instruction::getImm32((Instruction *)0x144aa3);
    emitByte(in_RDI,(byte)uVar1 & 0x3f);
  }
  else {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 2) + 200);
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) + 200);
  }
  return;
}

Assistant:

void JitCompilerX86::h_IROR_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_MOV_RR);
			emitByte(0xc8 + instr.src);
			emit(REX_ROT_CL);
			emitByte(0xc8 + instr.dst);
		}
		else {
			emit(REX_ROT_I8);
			emitByte(0xc8 + instr.dst);
			emitByte(instr.getImm32() & 63);
		}
	}